

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManLevelNum(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  int v;
  
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  iVar2 = 0;
  v = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return iVar2;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjIsBuf(pObj);
    if (iVar2 == 0) {
      iVar2 = (int)*(ulong *)pObj;
      uVar3 = *(ulong *)pObj & 0x1fffffff;
      if (uVar3 == 0x1fffffff || iVar2 < 0) {
        if (iVar2 < 0 && (int)uVar3 != 0x1fffffff) {
          Gia_ObjSetCoLevel(p,pObj);
        }
        else {
          Gia_ObjSetLevel(p,pObj,0);
        }
      }
      else {
        Gia_ObjSetGateLevel(p,pObj);
      }
    }
    else {
      Gia_ObjSetBufLevel(p,pObj);
    }
    iVar1 = p->nLevels;
    iVar2 = Gia_ObjLevel(p,pObj);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    p->nLevels = iVar2;
    v = v + 1;
  }
  return p->nLevels;
}

Assistant:

int Gia_ManLevelNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            Gia_ObjSetBufLevel( p, pObj );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else
            Gia_ObjSetLevel( p, pObj, 0 );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}